

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_zlib_decode_noheader_buffer(char *obuffer,int olen,char *ibuffer,int ilen)

{
  int iVar1;
  stbi__zbuf a;
  stbi__zbuf local_1010;
  
  local_1010.zbuffer_end = (stbi_uc *)(ibuffer + ilen);
  local_1010.zbuffer = (stbi_uc *)ibuffer;
  iVar1 = stbi__do_zlib(&local_1010,obuffer,olen,0,0);
  return -(uint)(iVar1 == 0) | (int)local_1010.zout - (int)local_1010.zout_start;
}

Assistant:

STBIDEF int stbi_zlib_decode_noheader_buffer(char *obuffer, int olen, const char *ibuffer, int ilen)
{
   stbi__zbuf a;
   a.zbuffer = (stbi_uc *) ibuffer;
   a.zbuffer_end = (stbi_uc *) ibuffer + ilen;
   if (stbi__do_zlib(&a, obuffer, olen, 0, 0))
      return (int) (a.zout - a.zout_start);
   else
      return -1;
}